

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O2

string * __thiscall
duckdb::Bit::BlobToBit_abi_cxx11_(string *__return_storage_ptr__,Bit *this,string_t blob)

{
  bitstring_t *output_str;
  ulong uVar1;
  string_t blob_00;
  unique_ptr<char[],_std::default_delete<char>,_false> buffer;
  _Head_base<0UL,_char_*,_false> local_38;
  anon_union_16_2_67f50693_for_value local_30;
  
  output_str = blob.value._8_8_;
  uVar1 = ((ulong)this & 0xffffffff) + 1;
  local_38._M_head_impl = (char *)operator_new__(uVar1);
  local_30.pointer.length = (uint32_t)uVar1;
  if (local_30.pointer.length < 0xd) {
    local_30._12_4_ = 0;
    local_30.pointer.prefix[0] = '\0';
    local_30.pointer.prefix[1] = '\0';
    local_30.pointer.prefix[2] = '\0';
    local_30.pointer.prefix[3] = '\0';
    local_30._8_4_ = 0;
    if (local_30.pointer.length != 0) {
      switchD_01939fa4::default
                (local_30.pointer.prefix,local_38._M_head_impl,
                 (ulong)(local_30.pointer.length & 0xf));
    }
  }
  else {
    local_30._8_4_ = SUB84(local_38._M_head_impl,0);
    local_30._12_4_ = (undefined4)((ulong)local_38._M_head_impl >> 0x20);
  }
  blob_00.value.pointer.ptr = (char *)&local_30;
  blob_00.value._0_8_ = blob.value._0_8_;
  BlobToBit(this,blob_00,output_str);
  string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&local_30.pointer);
  ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string Bit::BlobToBit(string_t blob) {
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(blob.GetSize() + 1);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(blob.GetSize() + 1));
	Bit::BlobToBit(blob, output_str);
	return output_str.GetString();
}